

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O3

void Dar_ObjCutPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  Dar_Cut_t *pCut;
  
  uVar2 = 0;
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  uVar1 = *(ulong *)&pObj->field_0x18;
  if (uVar1 >> 0x38 != 0) {
    pCut = (Dar_Cut_t *)(pObj->field_5).pData;
    do {
      if ((pCut->field_0x7 & 0x10) != 0) {
        Dar_CutPrint(pCut);
        uVar1 = *(ulong *)&pObj->field_0x18;
      }
      uVar2 = uVar2 + 1;
      pCut = pCut + 1;
    } while (uVar2 < (byte)(uVar1 >> 0x38));
  }
  return;
}

Assistant:

void Dar_ObjCutPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Dar_ObjForEachCut( pObj, pCut, i )
        Dar_CutPrint( pCut );
//    printf( "\n" );
}